

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t *
Acb_DerivePatchSupport
          (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  sat_solver *s;
  abctime aVar4;
  abctime aVar5;
  char *pStr;
  Vec_Int_t *p;
  Vec_Int_t *vWeights;
  Vec_Int_t *pVVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  abctime time;
  abctime time_00;
  abctime time_01;
  lit *plVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int Lit;
  Vec_Int_t *local_88;
  int pLits [2];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  int local_60;
  uint local_5c;
  abctime local_58;
  Vec_Int_t *local_50;
  Acb_Ntk_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = vDivs;
  local_48 = pNtkF;
  pVVar3 = Vec_IntAlloc(100);
  iVar2 = pCnf->nVars;
  s = sat_solver_new();
  local_78 = (ulong)(uint)nCoDivs;
  sat_solver_setnvars(s,nCoDivs + pCnf->nVars * 2);
  lVar7 = 0;
  while (lVar7 < pCnf->nClauses) {
    iVar1 = sat_solver_addclause(s,pCnf->pClauses[lVar7],pCnf->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Lit = 2;
  local_88 = pVVar3;
  iVar1 = sat_solver_addclause(s,&Lit,(lit *)&local_88);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pCnf->pMan = (Aig_Man_t *)0x0;
  Cnf_DataLift(pCnf,pCnf->nVars);
  lVar7 = 0;
  while (lVar7 < pCnf->nClauses) {
    iVar1 = sat_solver_addclause(s,pCnf->pClauses[lVar7],pCnf->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataLift(pCnf,-pCnf->nVars);
  Lit = Abc_Var2Lit(pCnf->nVars + 1,0);
  iVar1 = sat_solver_addclause(s,&Lit,(lit *)&local_88);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  iVar1 = (iVar2 - nTargets) + iTar;
  Lit = Abc_Var2Lit(iVar1,1);
  iVar2 = sat_solver_addclause(s,&Lit,(lit *)&local_88);
  if (iVar2 == 0) {
    return (Vec_Int_t *)0x0;
  }
  Lit = Abc_Var2Lit(iVar1 + pCnf->nVars,0);
  plVar10 = &Lit;
  iVar1 = sat_solver_addclause(s,plVar10,(lit *)&local_88);
  iVar2 = (int)plVar10;
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pVVar3 = local_88;
  if (0 < (int)local_78) {
    local_58 = Abc_Clock();
    uVar13 = pCnf->nVars;
    local_88->nSize = 0;
    if (vSuppOld != (Vec_Int_t *)0x0) {
      iVar2 = 0;
      local_68 = (ulong)uVar13;
      while (iVar2 < vSuppOld->nSize) {
        local_90 = iVar2;
        iVar2 = Vec_IntEntry(vSuppOld,iVar2);
        iVar2 = iVar2 + 2;
        iVar12 = pCnf->nVars + iVar2;
        pLits[0] = Abc_Var2Lit(iVar2,0);
        pLits[1] = Abc_Var2Lit(iVar12,1);
        iVar1 = sat_solver_addclause(s,pLits,(lit *)&local_78);
        if (iVar1 == 0) {
LAB_00328564:
          puts("Unsat is detected earlier.");
          iVar2 = local_90;
          break;
        }
        pLits[0] = Abc_Var2Lit(iVar2,1);
        pLits[1] = Abc_Var2Lit(iVar12,0);
        iVar2 = sat_solver_addclause(s,pLits,(lit *)&local_78);
        if (iVar2 == 0) goto LAB_00328564;
        iVar2 = local_90 + 1;
      }
      uVar13 = (uint)local_68;
      pVVar3 = local_88;
      if (vSuppOld->nSize != iVar2) goto LAB_003288dc;
    }
    local_70 = (ulong)(uVar13 * 2);
    uVar13 = uVar13 << 2;
    uVar8 = 0;
    uVar9 = 4;
    pVVar3 = local_88;
    while( true ) {
      iVar2 = (int)uVar8;
      if ((int)local_78 == iVar2) break;
      local_5c = (int)local_70 + iVar2;
      iVar2 = iVar2 + pCnf->nVars;
      uVar11 = iVar2 + 2;
      local_38 = uVar8;
      if ((int)(uVar11 | local_5c) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98 = (int)uVar9 + 1;
      local_94 = iVar2 + 3 + uVar11;
      local_9c = uVar13 + 1;
      local_90 = local_98;
      local_68 = (ulong)uVar13;
      local_60 = local_94;
      iVar2 = sat_solver_addclause(s,&local_9c,&local_90);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_9c = uVar13 + 1;
      local_98 = (int)uVar9;
      local_94 = uVar11 * 2;
      local_40 = uVar9;
      iVar2 = sat_solver_addclause(s,&local_9c,&local_90);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      iVar1 = (int)local_68;
      local_98 = local_90;
      local_9c = iVar1;
      local_94 = uVar11 * 2;
      iVar2 = sat_solver_addclause(s,&local_9c,&local_90);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      iVar12 = (int)local_40;
      local_94 = local_60;
      local_9c = iVar1;
      local_98 = iVar12;
      iVar2 = sat_solver_addclause(s,&local_9c,&local_90);
      pVVar3 = local_88;
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      iVar2 = Abc_Var2Lit(local_5c,1);
      Vec_IntPush(pVVar3,iVar2);
      uVar8 = (ulong)((int)local_38 + 1);
      uVar13 = iVar1 + 2;
      uVar9 = (ulong)(iVar12 + 2);
    }
    if (TimeOut != 0) {
      aVar4 = Abc_Clock();
      s->nRuntimeLimit = aVar4 + (long)TimeOut * 1000000;
    }
    plVar10 = pVVar3->pArray;
    iVar2 = pVVar3->nSize;
    iVar1 = sat_solver_solve(s,plVar10,plVar10 + iVar2,0,0,0,0);
    if (TimeOut != 0) {
      s->nRuntimeLimit = 0;
    }
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        printf("Support computation timed out after %d sec.\n",(ulong)(uint)TimeOut);
      }
      else {
        if (iVar1 != 1) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x4f5,
                        "Vec_Int_t *Acb_DerivePatchSupport(Cnf_Dat_t *, int, int, int, Vec_Int_t *, Acb_Ntk_t *, Vec_Int_t *, int)"
                       );
        }
        puts("ECO does not exist.");
      }
      sat_solver_delete(s);
      Vec_IntFree(pVVar3);
      return (Vec_Int_t *)0x0;
    }
    uVar11 = 0;
    printf("Proved that the problem has a solution.  ");
    aVar4 = Abc_Clock();
    Abc_PrintTime(0x816bba,(char *)(aVar4 - local_58),time);
    aVar4 = Abc_Clock();
    iVar2 = sat_solver_minimize_assumptions(s,plVar10,iVar2,0);
    Vec_IntShrink(pVVar3,iVar2);
    Vec_IntSort(pVVar3,iVar2);
    uVar13 = pVVar3->nSize;
    printf("Found one feasible set of %d divisors.  ",(ulong)uVar13);
    aVar5 = Abc_Clock();
    pStr = (char *)(aVar5 - aVar4);
    Abc_PrintTime(0x816bba,pStr,time_00);
    if (0 < (int)uVar13) {
      local_78 = Abc_Clock();
      p = Vec_IntDup(pVVar3);
      vWeights = Acb_DeriveWeights(local_50,local_48);
      pVVar6 = Acb_FindSupport(s,(int)local_70,vWeights,pVVar3,TimeOut);
      Vec_IntFree(vWeights);
      Vec_IntFree(pVVar3);
      if (pVVar6 == (Vec_Int_t *)0x0) {
        printf("Support minimization did not succeed.  ");
      }
      else {
        Vec_IntFree(p);
        printf("Minimized support to %d supp vars.  ",(ulong)(uint)pVVar6->nSize);
        p = pVVar6;
      }
      aVar4 = Abc_Clock();
      pStr = (char *)(aVar4 - local_78);
      Abc_PrintTime(0x816bba,pStr,time_01);
      pVVar3 = p;
    }
    for (; iVar2 = (int)pStr, (int)uVar11 < pVVar3->nSize; uVar11 = uVar11 + 1) {
      iVar2 = Vec_IntEntry(pVVar3,uVar11);
      iVar2 = Abc_Lit2Var(iVar2);
      pStr = (char *)(ulong)uVar11;
      Vec_IntWriteEntry(pVVar3,uVar11,iVar2 - (int)local_70);
    }
    Vec_IntSort(pVVar3,iVar2);
  }
LAB_003288dc:
  sat_solver_delete(s);
  if (pVVar3 == (Vec_Int_t *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  Vec_IntSort(pVVar3,iVar2);
  return pVVar3;
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupport( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nTargets;
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * pCnf->nVars + nCoDivs );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for targets
    // add negative literal
    Lit = Abc_Var2Lit( iCiVarBeg + iTar, 1 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add positive literal
    Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars + iTar, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, nSuppNew, status;
        int iDivVar = 2 * pCnf->nVars;
        int pLits[2];
        int j = 0, iDivOld;
        Vec_IntClear( vSupp );
        if ( vSuppOld )
        {
            // start with predefined support
            Vec_IntForEachEntry( vSuppOld, iDivOld, j )
            {
                int iVar0 = iCoVarBeg+1+iDivOld;
                int iVar1 = iCoVarBeg+1+iDivOld+pCnf->nVars;
                //printf( "Selecting predefined divisor %d with weight %d\n", 
                //    iDivOld, Vec_IntEntry(&pNtkF->vObjWeight, Vec_IntEntry(vDivs, iDivOld)) );
                // add equality clauses
                pLits[0] = Abc_Var2Lit( iVar0, 0 );
                pLits[1] = Abc_Var2Lit( iVar1, 1 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
                pLits[0] = Abc_Var2Lit( iVar0, 1 );
                pLits[1] = Abc_Var2Lit( iVar1, 0 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
            }
        }
        if ( vSuppOld == NULL || j == Vec_IntSize(vSuppOld) )
        {
            for ( i = 0; i < nCoDivs; i++ )
            {
                sat_solver_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
            }
            // try one run
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, TimeOut * CLOCKS_PER_SEC + Abc_Clock() );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, 0 );
            if ( status == l_True )
            {
                printf( "ECO does not exist.\n" );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            if ( status == l_Undef )
            {
                printf( "Support computation timed out after %d sec.\n", TimeOut );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            assert( status == l_False );
            printf( "Proved that the problem has a solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            // find minimum subset
            if ( fUseMinAssump )
            {
                int fUseSuppMin = 1;
                // solve in a standard way
                abctime clk = Abc_Clock();
                nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
                Vec_IntShrink( vSupp, nSuppNew );
                Vec_IntSort( vSupp, 0 );
                printf( "Found one feasible set of %d divisors.  ", Vec_IntSize(vSupp) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

                // perform minimization
                if ( fUseSuppMin && Vec_IntSize(vSupp) > 0 )
                {
                    abctime clk = Abc_Clock();
                    Vec_Int_t * vSupp2 = Vec_IntDup( vSupp );
                    Vec_Int_t * vTemp, * vWeights = Acb_DeriveWeights( vDivs, pNtkF );
                    vSupp = Acb_FindSupport( pSat, iDivVar, vWeights, vTemp = vSupp, TimeOut );
                    Vec_IntFree( vWeights );
                    Vec_IntFree( vTemp );
                    if ( vSupp == NULL )
                    {
                        printf( "Support minimization did not succeed.  " );
                        //sat_solver_delete( pSat );
                        vSupp = vSupp2;
                    }
                    else
                    {
                        Vec_IntFree( vSupp2 );
                        printf( "Minimized support to %d supp vars.  ", Vec_IntSize(vSupp) );
                    }
                    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
                }
            }
            else
            {
                int * pFinal, nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
                Vec_IntClear( vSupp ); 
                for ( i = 0; i < nFinal; i++ )
                    Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
                // try one run
                status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
                assert( status == l_False );
                // try again
                nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            }
            // remap them into numbers
            Vec_IntForEachEntry( vSupp, iLit, i )
                Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
            Vec_IntSort( vSupp, 0 );
        }
    }
    sat_solver_delete( pSat );
    if ( vSupp ) Vec_IntSort( vSupp, 0 );
    return vSupp;
}